

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

StringRef __thiscall
llvm::yaml::ScalarNode::unescapeDoubleQuoted
          (ScalarNode *this,StringRef UnquotedValue,size_type i,SmallVectorImpl<char> *Storage)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  uint Radix;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint32_t UnicodeScalarValue;
  llvm *plVar7;
  ulong uVar8;
  bool bVar9;
  StringRef SVar10;
  StringRef Chars;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  unsigned_long_long ULLVal;
  StringRef local_a8;
  uint32_t local_98;
  int iStack_94;
  iterator local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  ScalarNode *local_50;
  Twine local_48;
  
  local_a8.Length = UnquotedValue.Length;
  local_a8.Data = UnquotedValue.Data;
  (Storage->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_50 = this;
  if ((Storage->super_SmallVectorTemplateBase<char,_true>).
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < local_a8.Length)
  {
    SmallVectorBase::grow_pod((SmallVectorBase *)Storage,Storage + 1,local_a8.Length,1);
  }
  if (i != 0xffffffffffffffff) {
    uVar8 = 0;
    do {
      SmallVectorImpl<char>::insert<char_const*,void>
                (Storage,(iterator)
                         ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 Size +
                         (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX),local_a8.Data,local_a8.Data + i);
      uVar4 = i;
      if (local_a8.Length < i) {
        uVar4 = local_a8.Length;
      }
      uVar5 = local_a8.Length - uVar4;
      local_a8.Data = local_a8.Data + uVar4;
      if (local_a8.Length <= i) {
        local_a8.Length = uVar5;
        __assert_fail("!UnquotedValue.empty() && \"Can\'t be empty!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                      ,0x785,
                      "StringRef llvm::yaml::ScalarNode::unescapeDoubleQuoted(StringRef, StringRef::size_type, SmallVectorImpl<char> &) const"
                     );
      }
      if ((*local_a8.Data == '\r') || (*local_a8.Data == '\n')) {
        local_98 = CONCAT31(local_98._1_3_,10);
        local_a8.Length = uVar5;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_98);
        if ((1 < local_a8.Length) && ((local_a8.Data[1] == '\r' || (local_a8.Data[1] == '\n')))) {
          local_a8.Data = local_a8.Data + 1;
          local_a8.Length = local_a8.Length - 1;
        }
        local_a8.Data = local_a8.Data + (local_a8.Length != 0);
        bVar2 = true;
        local_a8.Length = local_a8.Length - (local_a8.Length != 0);
        goto LAB_0018d8ce;
      }
      bVar2 = true;
      local_a8.Length = uVar5;
      if (uVar5 == 1) goto LAB_0018d8ce;
      pcVar3 = local_a8.Data + 1;
      local_a8.Length = uVar5 - 1;
      bVar1 = local_a8.Data[1];
      Radix = (uint)&local_98;
      if (bVar1 < 0x5c) {
        if (bVar1 < 0x2f) {
          if (bVar1 < 0xd) {
            if (bVar1 == 9) goto switchD_0018d938_caseD_74;
            if (bVar1 != 10) goto switchD_0018d938_caseD_5d;
          }
          else if (bVar1 != 0xd) {
            if (bVar1 == 0x20) {
              local_98 = CONCAT31(local_98._1_3_,0x20);
            }
            else {
              if (bVar1 != 0x22) goto switchD_0018d938_caseD_5d;
              local_98 = CONCAT31(local_98._1_3_,0x22);
            }
            goto LAB_0018dc47;
          }
          if ((1 < local_a8.Length) && ((local_a8.Data[2] == '\r' || (local_a8.Data[2] == '\n')))) {
            local_a8.Length = uVar5 - 2;
            pcVar3 = local_a8.Data + 2;
          }
        }
        else {
          switch((unsigned_long_long *)(ulong)(bVar1 - 0x4c)) {
          case (unsigned_long_long *)0x0:
            UnicodeScalarValue = 0x2028;
            break;
          case (unsigned_long_long *)0x1:
          case (unsigned_long_long *)0x3:
          case (unsigned_long_long *)0x5:
          case (unsigned_long_long *)0x6:
          case (unsigned_long_long *)0x7:
          case (unsigned_long_long *)0x8:
switchD_0018d938_caseD_5d:
            local_98 = 0;
            local_80 = &local_70;
            local_78 = 0;
            local_70 = 0;
            uStack_88 = 1;
            local_a8.Data = pcVar3;
            local_90 = pcVar3;
            Twine::Twine(&local_48,"Unrecognized escape code!");
            Scanner::setError(*(Scanner **)
                               &((((local_50->super_Node).Doc)->_M_t).
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream->scanner,&local_48,local_90);
            if (local_80 != &local_70) {
              operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
            }
            bVar2 = false;
            goto LAB_0018d8ce;
          case (unsigned_long_long *)0x2:
            UnicodeScalarValue = 0x85;
            break;
          case (unsigned_long_long *)0x4:
            UnicodeScalarValue = 0x2029;
            break;
          case (unsigned_long_long *)0x9:
            if (8 < local_a8.Length) {
              plVar7 = (llvm *)(local_a8.Data + 2);
              pcVar6 = (char *)(uVar5 - 2);
              if ((char *)0x7 < pcVar6) {
                pcVar6 = (char *)0x8;
              }
              Str_01.Length = 0x10;
              Str_01.Data = pcVar6;
              local_a8.Data = pcVar3;
              bVar9 = getAsUnsignedInteger
                                (plVar7,Str_01,Radix,(unsigned_long_long *)(ulong)(bVar1 - 0x4c));
              local_5c = local_98;
              if (iStack_94 != 0 || bVar9) {
                local_5c = 0xfffd;
              }
              encodeUTF8(local_5c,Storage);
              bVar9 = local_a8.Length < 8;
              uVar4 = 8;
              goto LAB_0018dc30;
            }
            goto LAB_0018dc52;
          default:
            if (bVar1 == 0x2f) {
              local_98 = CONCAT31(local_98._1_3_,0x2f);
            }
            else {
              if (bVar1 != 0x30) goto switchD_0018d938_caseD_5d;
              local_98 = (uint)local_98._1_3_ << 8;
            }
            goto LAB_0018dc47;
          }
LAB_0018dbc2:
          local_a8.Data = pcVar3;
          encodeUTF8(UnicodeScalarValue,Storage);
          pcVar3 = local_a8.Data;
        }
        goto LAB_0018dc52;
      }
      switch(bVar1) {
      case 0x5c:
        local_98 = CONCAT31(local_98._1_3_,0x5c);
        break;
      default:
        goto switchD_0018d938_caseD_5d;
      case 0x5f:
        UnicodeScalarValue = 0xa0;
        goto LAB_0018dbc2;
      case 0x61:
        local_98 = CONCAT31(local_98._1_3_,7);
        break;
      case 0x62:
        local_98 = CONCAT31(local_98._1_3_,8);
        break;
      case 0x65:
        local_98 = CONCAT31(local_98._1_3_,0x1b);
        break;
      case 0x66:
        local_98 = CONCAT31(local_98._1_3_,0xc);
        break;
      case 0x6e:
        local_98 = CONCAT31(local_98._1_3_,10);
        break;
      case 0x72:
        local_98 = CONCAT31(local_98._1_3_,0xd);
        break;
      case 0x74:
switchD_0018d938_caseD_74:
        local_98 = CONCAT31(local_98._1_3_,9);
        break;
      case 0x75:
        if (4 < local_a8.Length) {
          plVar7 = (llvm *)(local_a8.Data + 2);
          pcVar6 = (char *)(uVar5 - 2);
          if ((char *)0x3 < pcVar6) {
            pcVar6 = (char *)0x4;
          }
          Str.Length = 0x10;
          Str.Data = pcVar6;
          local_a8.Data = pcVar3;
          bVar9 = getAsUnsignedInteger
                            (plVar7,Str,Radix,
                             (unsigned_long_long *)&switchD_0018d938::switchdataD_001d65ec);
          local_58 = local_98;
          if (iStack_94 != 0 || bVar9) {
            local_58 = 0xfffd;
          }
          encodeUTF8(local_58,Storage);
          bVar9 = local_a8.Length < 4;
          uVar4 = 4;
LAB_0018dc30:
          if (bVar9) {
            uVar4 = local_a8.Length;
          }
          local_a8.Length = local_a8.Length - uVar4;
          pcVar3 = local_a8.Data + uVar4;
        }
        goto LAB_0018dc52;
      case 0x76:
        local_98 = CONCAT31(local_98._1_3_,0xb);
        break;
      case 0x78:
        if (2 < local_a8.Length) {
          plVar7 = (llvm *)(local_a8.Data + 2);
          pcVar6 = (char *)(uVar5 - 2);
          if ((char *)0x1 < pcVar6) {
            pcVar6 = (char *)0x2;
          }
          Str_00.Length = 0x10;
          Str_00.Data = pcVar6;
          local_a8.Data = pcVar3;
          bVar9 = getAsUnsignedInteger
                            (plVar7,Str_00,Radix,
                             (unsigned_long_long *)&switchD_0018d938::switchdataD_001d65ec);
          local_54 = local_98;
          if (iStack_94 != 0 || bVar9) {
            local_54 = 0xfffd;
          }
          encodeUTF8(local_54,Storage);
          bVar9 = local_a8.Length < 2;
          uVar4 = 2;
          goto LAB_0018dc30;
        }
        goto LAB_0018dc52;
      }
LAB_0018dc47:
      local_a8.Data = pcVar3;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_98);
      pcVar3 = local_a8.Data;
LAB_0018dc52:
      local_a8.Data = pcVar3;
      bVar9 = local_a8.Length != 0;
      local_a8.Length = local_a8.Length - bVar9;
      local_a8.Data = local_a8.Data + bVar9;
LAB_0018d8ce:
      if (!bVar2) {
        pcVar3 = "";
        goto LAB_0018dc9a;
      }
      Chars.Length = 3;
      Chars.Data = "\\\r\n";
      i = StringRef::find_first_of(&local_a8,Chars,0);
    } while (i != 0xffffffffffffffff);
  }
  SmallVectorImpl<char>::insert<char_const*,void>
            (Storage,(iterator)
                     ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX),local_a8.Data,local_a8.Data + local_a8.Length);
  pcVar3 = (char *)(Storage->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar8 = (ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
LAB_0018dc9a:
  SVar10.Length = uVar8;
  SVar10.Data = pcVar3;
  return SVar10;
}

Assistant:

StringRef ScalarNode::unescapeDoubleQuoted( StringRef UnquotedValue
                                          , StringRef::size_type i
                                          , SmallVectorImpl<char> &Storage)
                                          const {
  // Use Storage to build proper value.
  Storage.clear();
  Storage.reserve(UnquotedValue.size());
  for (; i != StringRef::npos; i = UnquotedValue.find_first_of("\\\r\n")) {
    // Insert all previous chars into Storage.
    StringRef Valid(UnquotedValue.begin(), i);
    Storage.insert(Storage.end(), Valid.begin(), Valid.end());
    // Chop off inserted chars.
    UnquotedValue = UnquotedValue.substr(i);

    assert(!UnquotedValue.empty() && "Can't be empty!");

    // Parse escape or line break.
    switch (UnquotedValue[0]) {
    case '\r':
    case '\n':
      Storage.push_back('\n');
      if (   UnquotedValue.size() > 1
          && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
        UnquotedValue = UnquotedValue.substr(1);
      UnquotedValue = UnquotedValue.substr(1);
      break;
    default:
      if (UnquotedValue.size() == 1)
        // TODO: Report error.
        break;
      UnquotedValue = UnquotedValue.substr(1);
      switch (UnquotedValue[0]) {
      default: {
          Token T;
          T.Range = StringRef(UnquotedValue.begin(), 1);
          setError("Unrecognized escape code!", T);
          return "";
        }
      case '\r':
      case '\n':
        // Remove the new line.
        if (   UnquotedValue.size() > 1
            && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
          UnquotedValue = UnquotedValue.substr(1);
        // If this was just a single byte newline, it will get skipped
        // below.
        break;
      case '0':
        Storage.push_back(0x00);
        break;
      case 'a':
        Storage.push_back(0x07);
        break;
      case 'b':
        Storage.push_back(0x08);
        break;
      case 't':
      case 0x09:
        Storage.push_back(0x09);
        break;
      case 'n':
        Storage.push_back(0x0A);
        break;
      case 'v':
        Storage.push_back(0x0B);
        break;
      case 'f':
        Storage.push_back(0x0C);
        break;
      case 'r':
        Storage.push_back(0x0D);
        break;
      case 'e':
        Storage.push_back(0x1B);
        break;
      case ' ':
        Storage.push_back(0x20);
        break;
      case '"':
        Storage.push_back(0x22);
        break;
      case '/':
        Storage.push_back(0x2F);
        break;
      case '\\':
        Storage.push_back(0x5C);
        break;
      case 'N':
        encodeUTF8(0x85, Storage);
        break;
      case '_':
        encodeUTF8(0xA0, Storage);
        break;
      case 'L':
        encodeUTF8(0x2028, Storage);
        break;
      case 'P':
        encodeUTF8(0x2029, Storage);
        break;
      case 'x': {
          if (UnquotedValue.size() < 3)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 2).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(2);
          break;
        }
      case 'u': {
          if (UnquotedValue.size() < 5)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 4).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(4);
          break;
        }
      case 'U': {
          if (UnquotedValue.size() < 9)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 8).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(8);
          break;
        }
      }
      UnquotedValue = UnquotedValue.substr(1);
    }
  }
  Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
  return StringRef(Storage.begin(), Storage.size());
}